

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_compression.c
# Opt level: O0

int build_compressed(st_ptls_compressed_certificate_entry_t *entry,ptls_iovec_t *certificates,
                    size_t num_certificates,ptls_iovec_t ocsp_status)

{
  int iVar1;
  uint8_t *puVar2;
  undefined8 local_80;
  uint8_t *local_78;
  size_t local_70;
  ptls_iovec_t local_68;
  int local_54;
  undefined1 auStack_50 [4];
  int ret;
  ptls_buffer_t uncompressed;
  size_t num_certificates_local;
  ptls_iovec_t *certificates_local;
  st_ptls_compressed_certificate_entry_t *entry_local;
  ptls_iovec_t ocsp_status_local;
  
  uncompressed._24_8_ = num_certificates;
  ptls_buffer_init((ptls_buffer_t *)auStack_50,"",0);
  local_68 = ptls_iovec_init((void *)0x0,0);
  local_54 = ptls_build_certificate_message
                       ((ptls_buffer_t *)auStack_50,local_68,certificates,uncompressed._24_8_,
                        ocsp_status);
  if (local_54 == 0) {
    entry->uncompressed_length = (uint32_t)uncompressed.capacity;
    (entry->bytes).len = uncompressed.capacity - 1;
    puVar2 = (uint8_t *)malloc((entry->bytes).len);
    (entry->bytes).base = puVar2;
    if (puVar2 == (uint8_t *)0x0) {
      local_54 = 0x201;
    }
    else {
      iVar1 = BrotliEncoderCompress
                        (0xb,0x16,0,uncompressed.capacity,_auStack_50,&(entry->bytes).len,
                         (entry->bytes).base);
      if (iVar1 == 1) {
        local_54 = 0;
      }
      else {
        local_54 = 0x208;
      }
    }
  }
  if (local_54 != 0) {
    free((entry->bytes).base);
    memset(&local_80,0,0x18);
    *(undefined8 *)entry = local_80;
    (entry->bytes).base = local_78;
    (entry->bytes).len = local_70;
  }
  ptls_buffer_dispose((ptls_buffer_t *)auStack_50);
  return local_54;
}

Assistant:

static int build_compressed(struct st_ptls_compressed_certificate_entry_t *entry, ptls_iovec_t *certificates,
                            size_t num_certificates, ptls_iovec_t ocsp_status)
{
    ptls_buffer_t uncompressed;
    int ret;

    ptls_buffer_init(&uncompressed, "", 0);

    /* build uncompressed */
    if ((ret = ptls_build_certificate_message(&uncompressed, ptls_iovec_init(NULL, 0), certificates, num_certificates,
                                              ocsp_status)) != 0)
        goto Exit;
    entry->uncompressed_length = (uint32_t)uncompressed.off;

    /* compress */
    entry->bytes.len = uncompressed.off - 1;
    if ((entry->bytes.base = malloc(entry->bytes.len)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (BrotliEncoderCompress(BROTLI_MAX_QUALITY, BROTLI_DEFAULT_WINDOW, BROTLI_MODE_GENERIC, uncompressed.off, uncompressed.base,
                              &entry->bytes.len, entry->bytes.base) != BROTLI_TRUE) {
        ret = PTLS_ERROR_COMPRESSION_FAILURE;
        goto Exit;
    }

    ret = 0;

Exit:
    if (ret != 0) {
        free(entry->bytes.base);
        *entry = (struct st_ptls_compressed_certificate_entry_t){0};
    }
    ptls_buffer_dispose(&uncompressed);
    return ret;
}